

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PsxRelocator.cpp
# Opt level: O0

bool __thiscall PsxRelocator::relocate(PsxRelocator *this,int *memoryAddress)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  size_t sVar6;
  reference file_00;
  int newCrc;
  PsxRelocatorFile *file;
  iterator __end1;
  iterator __begin1;
  vector<PsxRelocatorFile,_std::allocator<PsxRelocatorFile>_> *__range1;
  byte local_1d;
  int start;
  bool error;
  int oldCrc;
  int *memoryAddress_local;
  PsxRelocator *this_local;
  
  pbVar5 = ByteArray::data(&this->outputData,0);
  sVar6 = ByteArray::size(&this->outputData);
  uVar3 = getCrc32(pbVar5,sVar6);
  ByteArray::clear(&this->outputData);
  this->dataChanged = false;
  local_1d = 0;
  iVar1 = *memoryAddress;
  __end1 = std::vector<PsxRelocatorFile,_std::allocator<PsxRelocatorFile>_>::begin(&this->files);
  file = (PsxRelocatorFile *)
         std::vector<PsxRelocatorFile,_std::allocator<PsxRelocatorFile>_>::end(&this->files);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<PsxRelocatorFile_*,_std::vector<PsxRelocatorFile,_std::allocator<PsxRelocatorFile>_>_>
                                *)&file);
    if (!bVar2) break;
    file_00 = __gnu_cxx::
              __normal_iterator<PsxRelocatorFile_*,_std::vector<PsxRelocatorFile,_std::allocator<PsxRelocatorFile>_>_>
              ::operator*(&__end1);
    bVar2 = relocateFile(this,file_00,memoryAddress);
    if (!bVar2) {
      local_1d = 1;
    }
    __gnu_cxx::
    __normal_iterator<PsxRelocatorFile_*,_std::vector<PsxRelocatorFile,_std::allocator<PsxRelocatorFile>_>_>
    ::operator++(&__end1);
  }
  pbVar5 = ByteArray::data(&this->outputData,0);
  sVar6 = ByteArray::size(&this->outputData);
  uVar4 = getCrc32(pbVar5,sVar6);
  if (uVar3 != uVar4) {
    this->dataChanged = true;
  }
  *memoryAddress = *memoryAddress - iVar1;
  return (bool)((local_1d ^ 0xff) & 1);
}

Assistant:

bool PsxRelocator::relocate(int& memoryAddress)
{
	int oldCrc = getCrc32(outputData.data(),outputData.size());
	outputData.clear();
	dataChanged = false;

	bool error = false;
	int start = memoryAddress;

	for (PsxRelocatorFile& file: files)
	{
		if (!relocateFile(file,memoryAddress))
			error = true;
	}
	
	int newCrc = getCrc32(outputData.data(),outputData.size());
	if (oldCrc != newCrc)
		dataChanged = true;

	memoryAddress -= start;
	return !error;
}